

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  Dispatch_Engine *this;
  _Alloc_hider _Var2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer pcVar5;
  ostream *poVar6;
  size_t __len2;
  istream *piVar7;
  undefined8 uVar8;
  size_type sVar9;
  int iVar10;
  char *pcVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  int iVar12;
  initializer_list<chaiscript::Options> __l;
  string arg;
  string line;
  __string_type __str;
  char *modulepath;
  char *usepath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulepaths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usepaths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  searchpaths;
  ChaiScript_Basic chai;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  ModulePtr local_498;
  undefined1 local_488 [48];
  undefined1 local_458 [40];
  _Head_base<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_false> local_430;
  pointer local_428;
  pointer local_420;
  pointer local_418;
  char **local_410;
  char *local_408;
  char *local_400;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  undefined1 local_370 [32];
  ChaiScript_Basic local_350;
  
  local_410 = argv;
  local_400 = getenv("CHAI_USE_PATH");
  local_408 = getenv("CHAI_MODULE_PATH");
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3d8,
             (char (*) [1])0x366f09);
  if (local_400 != (char *)0x0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3d8,
               &local_400);
  }
  local_3f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  default_search_paths_abi_cxx11_();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3f8,
             local_3f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             local_3b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_3b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3f8,
             (char (*) [1])0x366f09);
  if (local_408 != (char *)0x0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3f8,
               &local_408);
  }
  create_chaiscript_stdlib();
  create_chaiscript_parser();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_388,&local_3f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3a0,&local_3d8);
  local_458._0_8_ = (pointer)0x300000001;
  __l._M_len = 2;
  __l._M_array = (iterator)local_458;
  std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::vector
            ((vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *)&local_4b8,__l,
             (allocator_type *)(local_488 + 0x2f));
  chaiscript::ChaiScript_Basic::ChaiScript_Basic
            (&local_350,&local_498,
             (unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
              *)&local_430,&local_388,&local_3a0,
             (vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *)&local_4b8);
  if (local_4b8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_4b8._M_dataplus._M_p,
                    local_4b8.field_2._M_allocated_capacity - (long)local_4b8._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_388);
  if (local_430._M_head_impl != (ChaiScript_Parser_Base *)0x0) {
    (*(local_430._M_head_impl)->_vptr_ChaiScript_Parser_Base[4])();
  }
  if (local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_458._0_8_ = myexit;
  chaiscript::dispatch::detail::make_callable_impl<void(*)(int),false,false,false,false,void,int>
            (&local_498);
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"exit","");
  chaiscript::Name_Validator::validate_object_name<std::__cxx11::string>(&local_4b8);
  this = &local_350.m_engine;
  chaiscript::detail::Dispatch_Engine::add_function(this,(Proxy_Function *)&local_498,&local_4b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if (local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_458._0_8_ = myexit;
  chaiscript::dispatch::detail::make_callable_impl<void(*)(int),false,false,false,false,void,int>
            (&local_498);
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"quit","");
  chaiscript::Name_Validator::validate_object_name<std::__cxx11::string>(&local_4b8);
  chaiscript::detail::Dispatch_Engine::add_function(this,(Proxy_Function *)&local_498,&local_4b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if (local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_458._0_8_ = help;
  chaiscript::dispatch::detail::make_callable_impl<void(*)(int),false,false,false,false,void,int>
            (&local_498);
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"help","");
  chaiscript::Name_Validator::validate_object_name<std::__cxx11::string>(&local_4b8);
  chaiscript::detail::Dispatch_Engine::add_function(this,(Proxy_Function *)&local_498,&local_4b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if (local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_458._0_8_ = throws_exception_abi_cxx11_;
  chaiscript::dispatch::detail::
  make_callable_impl<std::__cxx11::string(*)(std::function<void()>const&),false,false,false,false,std::__cxx11::string,std::function<void()>const&>
            (&local_498);
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"throws_exception","");
  chaiscript::Name_Validator::validate_object_name<std::__cxx11::string>(&local_4b8);
  chaiscript::detail::Dispatch_Engine::add_function(this,(Proxy_Function *)&local_498,&local_4b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if (local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_458._0_8_ = get_eval_error;
  chaiscript::dispatch::detail::
  make_callable_impl<chaiscript::exception::eval_error(*)(std::function<void()>const&),false,false,false,false,chaiscript::exception::eval_error,std::function<void()>const&>
            (&local_498);
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"get_eval_error","");
  chaiscript::Name_Validator::validate_object_name<std::__cxx11::string>(&local_4b8);
  chaiscript::detail::Dispatch_Engine::add_function(this,(Proxy_Function *)&local_498,&local_4b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if (local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_458._0_8_ = now;
  chaiscript::dispatch::detail::make_callable_impl<double(*)(),false,false,false,false,double>
            (&local_498);
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"now","");
  chaiscript::Name_Validator::validate_object_name<std::__cxx11::string>(&local_4b8);
  chaiscript::detail::Dispatch_Engine::add_function(this,(Proxy_Function *)&local_498,&local_4b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if (local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (0 < argc) {
    local_488._32_8_ = (pointer)0x0;
    local_420 = (pointer)0x0;
    iVar4 = 0;
    local_428 = (pointer)0x0;
    local_418 = (pointer)0x0;
    local_488._28_4_ = argc;
    do {
      iVar10 = iVar4;
      if (iVar4 == 0) {
        iVar10 = 1;
      }
      if (argc == 1) {
        iVar10 = iVar4;
      }
      pcVar11 = "--interactive";
      if (iVar10 != 0) {
        pcVar11 = local_410[iVar10];
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b8,pcVar11,(allocator<char> *)&local_498);
      iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_4b8,"-c");
      if ((iVar4 == 0) ||
         (iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_4b8,"--command"), iVar4 == 0)) {
        sVar9 = local_4b8._M_string_length;
        iVar4 = iVar10 + 1;
        if (argc <= iVar4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"insufficient input following ",0x1d);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_4b8._M_dataplus._M_p,
                              local_4b8._M_string_length);
          local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               CONCAT71(local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_498,1);
LAB_0029e9f9:
          bVar1 = true;
          local_488._32_8_ = (pointer)0x1;
          argc = local_488._28_4_;
          goto LAB_0029ebff;
        }
        pcVar11 = local_410[iVar4];
        __len2 = strlen(pcVar11);
        iVar12 = 1;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_4b8,0,sVar9,pcVar11,__len2);
        iVar10 = iVar4;
LAB_0029eb25:
        if (iVar12 == 1) {
          local_458._0_8_ = (pointer)0x0;
          local_458._8_8_ = (pointer)0x0;
          local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_488;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"__EVAL__","");
          chaiscript::ChaiScript_Basic::eval
                    ((ChaiScript_Basic *)(local_370 + 0x10),(string *)&local_350,
                     (Exception_Handler *)&local_4b8,(string *)local_458);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._24_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._24_8_);
          }
          this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_458._8_8_;
          if (local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)local_488) {
            operator_delete(local_498.
                            super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,CONCAT71(local_488._1_7_,local_488[0]) + 1);
            this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_458._8_8_;
          }
        }
        else {
          if (iVar12 != 2) {
            interactive(&local_350);
            uVar8 = __cxa_rethrow();
            __cxa_end_catch();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
              operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1
                             );
            }
            chaiscript::ChaiScript_Basic::~ChaiScript_Basic(&local_350);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_3b8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_3f8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_3d8);
            _Unwind_Resume(uVar8);
          }
          local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          chaiscript::ChaiScript_Basic::eval_file
                    ((ChaiScript_Basic *)local_370,(string *)&local_350,
                     (Exception_Handler *)&local_4b8);
          this_00._M_pi =
               local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._8_8_);
            this_00._M_pi =
                 local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
        }
        if ((pointer)this_00._M_pi != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        }
        bVar1 = false;
        argc = local_488._28_4_;
      }
      else {
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_4b8,"-");
        if ((iVar4 == 0) ||
           (iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_4b8,"--stdin"), iVar4 == 0)) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(&local_4b8,0,local_4b8._M_string_length,"",0);
          local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_488[0] = 0;
          local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_488;
          while( true ) {
            cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x80);
            piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)&std::cin,(string *)&local_498,cVar3);
            if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
            local_458._0_8_ = (pointer)(local_458 + 0x10);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_458,
                       local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,(undefined1 *)
                              ((long)&(local_498.
                                       super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                              (long)local_498.
                                    super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_458,local_458._8_8_,0,1,'\n');
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_4b8,(char *)local_458._0_8_,local_458._8_8_);
            if ((pointer)local_458._0_8_ != (pointer)(local_458 + 0x10)) {
              operator_delete((void *)local_458._0_8_,(ulong)(local_458._16_8_ + 1));
            }
          }
          if (local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)local_488) {
            operator_delete(local_498.
                            super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,CONCAT71(local_488._1_7_,local_488[0]) + 1);
          }
          iVar12 = 1;
          goto LAB_0029eb25;
        }
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_4b8,"-v");
        sVar9 = 0x10;
        if (iVar4 == 0) {
          pcVar11 = "print(version())";
LAB_0029eb0d:
          iVar12 = 1;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(&local_4b8,0,local_4b8._M_string_length,pcVar11,sVar9);
          goto LAB_0029eb25;
        }
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_4b8,"--version");
        pcVar11 = "print(version())";
        if (iVar4 == 0) goto LAB_0029eb0d;
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_4b8,"-h");
        sVar9 = 8;
        if (iVar4 == 0) {
          pcVar11 = "help(-1)";
          goto LAB_0029eb0d;
        }
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_4b8,"--help");
        pcVar11 = "help(-1)";
        if (iVar4 == 0) goto LAB_0029eb0d;
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_4b8,"-e");
        uVar8 = CONCAT44(extraout_var,iVar4);
        bVar1 = false;
        if (iVar4 == 0) {
LAB_0029ec38:
          local_420 = (pointer)CONCAT71((int7)((ulong)uVar8 >> 8),1);
        }
        else {
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_4b8,"--evalerrorok");
          uVar8 = CONCAT44(extraout_var_00,iVar4);
          if (iVar4 == 0) goto LAB_0029ec38;
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_4b8,"--exception");
          if (iVar4 == 0) {
            local_418 = (pointer)CONCAT71((int7)(CONCAT44(extraout_var_01,iVar4) >> 8),1);
          }
          else {
            iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_4b8,"--any-exception");
            if (iVar4 != 0) {
              iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (&local_4b8,"-i");
              iVar12 = 0;
              if ((((iVar4 != 0) &&
                   (iVar4 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_4b8,"--interactive"),
                   _Var2._M_p = local_4b8._M_dataplus._M_p, iVar4 != 0)) &&
                  (iVar12 = 2, local_4b8._M_string_length != 0)) &&
                 (pcVar5 = (pointer)memchr(local_4b8._M_dataplus._M_p,0x2d,
                                           local_4b8._M_string_length),
                 pcVar5 == _Var2._M_p && pcVar5 != (pointer)0x0)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"unrecognised argument ",0x16);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,local_4b8._M_dataplus._M_p,
                                    local_4b8._M_string_length);
                local_498.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (element_type *)
                       CONCAT71(local_498.
                                super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr._1_7_,10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_498,1);
                goto LAB_0029e9f9;
              }
              goto LAB_0029eb25;
            }
            local_428 = (pointer)CONCAT71((int7)(CONCAT44(extraout_var_02,iVar4) >> 8),1);
          }
        }
      }
LAB_0029ebff:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
      }
      if (bVar1) {
        iVar4 = (int)local_488._32_8_;
        goto LAB_0029eeec;
      }
      iVar4 = iVar10 + 1;
    } while (iVar4 < argc);
  }
  iVar4 = 0;
LAB_0029eeec:
  chaiscript::ChaiScript_Basic::~ChaiScript_Basic(&local_350);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3d8);
  return iVar4;
}

Assistant:

int main(int argc, char *argv[]) {
// Disable deprecation warning for getenv call.
#ifdef CHAISCRIPT_MSVC
#pragma warning(push)
#pragma warning(disable : 4996)
#endif

  const char *usepath = getenv("CHAI_USE_PATH");
  const char *modulepath = getenv("CHAI_MODULE_PATH");

#ifdef CHAISCRIPT_MSVC
#pragma warning(pop)
#endif

  std::vector<std::string> usepaths;
  usepaths.emplace_back("");
  if (usepath != nullptr) {
    usepaths.emplace_back(usepath);
  }

  std::vector<std::string> modulepaths;
  std::vector<std::string> searchpaths = default_search_paths();
  modulepaths.insert(modulepaths.end(), searchpaths.begin(), searchpaths.end());
  modulepaths.emplace_back("");
  if (modulepath != nullptr) {
    modulepaths.emplace_back(modulepath);
  }

  chaiscript::ChaiScript_Basic chai(create_chaiscript_stdlib(), create_chaiscript_parser(), modulepaths, usepaths);

  chai.add(chaiscript::fun(&myexit), "exit");
  chai.add(chaiscript::fun(&myexit), "quit");
  chai.add(chaiscript::fun(&help), "help");
  chai.add(chaiscript::fun(&throws_exception), "throws_exception");
  chai.add(chaiscript::fun(&get_eval_error), "get_eval_error");
  chai.add(chaiscript::fun(&now), "now");

  bool eval_error_ok = false;
  bool boxed_exception_ok = false;
  bool any_exception_ok = false;

  for (int i = 0; i < argc; ++i) {
    if (i == 0 && argc > 1) {
      ++i;
    }

    std::string arg(i != 0 ? argv[i] : "--interactive");

    enum {
      eInteractive,
      eCommand,
      eFile
    } mode
        = eCommand;

    if (arg == "-c" || arg == "--command") {
      if ((i + 1) >= argc) {
        std::cout << "insufficient input following " << arg << '\n';
        return EXIT_FAILURE;
      }
      arg = argv[++i];

    } else if (arg == "-" || arg == "--stdin") {
      arg = "";
      std::string line;
      while (std::getline(std::cin, line)) {
        arg += line + '\n';
      }
    } else if (arg == "-v" || arg == "--version") {
      arg = "print(version())";
    } else if (arg == "-h" || arg == "--help") {
      arg = "help(-1)";
    } else if (arg == "-e" || arg == "--evalerrorok") {
      eval_error_ok = true;
      continue;
    } else if (arg == "--exception") {
      boxed_exception_ok = true;
      continue;
    } else if (arg == "--any-exception") {
      any_exception_ok = true;
      continue;
    } else if (arg == "-i" || arg == "--interactive") {
      mode = eInteractive;
    } else if (arg.find('-') == 0) {
      std::cout << "unrecognised argument " << arg << '\n';
      return EXIT_FAILURE;
    } else {
      mode = eFile;
    }

    try {
      switch (mode) {
        case eInteractive:
          interactive(chai);
          break;
        case eCommand:
          chai.eval(arg);
          break;
        case eFile:
          chai.eval_file(arg);
      }
    } catch (const chaiscript::exception::eval_error &ee) {
      std::cout << ee.pretty_print();
      std::cout << '\n';

      if (!eval_error_ok) {
        return EXIT_FAILURE;
      }
    } catch (const chaiscript::Boxed_Value &e) {
      std::cout << "Unhandled exception thrown of type " << e.get_type_info().name() << '\n';

      if (!boxed_exception_ok) {
        return EXIT_FAILURE;
      }
    } catch (const chaiscript::exception::load_module_error &e) {
      std::cout << "Unhandled module load error\n"
                << e.what() << '\n';
    } catch (std::exception &e) {
      std::cout << "Unhandled standard exception: " << e.what() << '\n';
      if (!any_exception_ok) {
        throw;
      }
    } catch (...) {
      std::cout << "Unhandled unknown exception" << '\n';
      if (!any_exception_ok) {
        throw;
      }
    }
  }

  return EXIT_SUCCESS;
}